

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O2

int Cec2_ManPerformSweeping(Gia_Man_t *p,Cec2_Par_t *pPars,Gia_Man_t **ppNew)

{
  ulong uVar1;
  Vec_Int_t *pVVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Cec2_Man_t *pMan;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  Gia_Man_t *pGVar10;
  char *pcVar11;
  Abc_Cex_t *pAVar12;
  int iVar13;
  long lVar14;
  
  pMan = Cec2_ManCreate(p,pPars);
  Gia_ManRandomW(1);
  Gia_ManSetPhase(p);
  if (pPars->fIsMiter != 0) {
    iVar13 = 0;
    while ((iVar13 < p->vCos->nSize && (pGVar8 = Gia_ManCo(p,iVar13), pGVar8 != (Gia_Obj_t *)0x0)))
    {
      if (*(long *)pGVar8 < 0) {
        pAVar12 = Cec2_ManDeriveCex(p,iVar13,-1);
        p->pCexSeq = pAVar12;
        goto LAB_00520ca7;
      }
      iVar13 = iVar13 + 1;
    }
  }
  Cec2_ManSimAlloc(p,pPars->nSimWords);
  Cec2_ManSimulateCis(p);
  iVar13 = 0;
  Cec2_ManSimulate(p,(Vec_Int_t *)0x0,pMan);
  if ((pPars->fIsMiter == 0) || (iVar4 = Cec2_ManSimulateCos(p), iVar4 != 0)) {
    Cec2_ManCreateClasses(p,pMan);
    Cec2_ManPrintStats(p,pPars,pMan);
    for (; iVar13 < pPars->nSimRounds; iVar13 = iVar13 + 1) {
      Cec2_ManSimulateCis(p);
      Cec2_ManSimulate(p,(Vec_Int_t *)0x0,pMan);
      if ((pPars->fIsMiter != 0) && (iVar4 = Cec2_ManSimulateCos(p), iVar4 == 0)) goto LAB_00520ca7;
      Cec2_ManPrintStats(p,pPars,pMan);
    }
    bVar3 = true;
    for (iVar13 = 0; (bVar3 && (iVar13 < pPars->nItersMax)); iVar13 = iVar13 + 1) {
      pMan->nPatterns = 0;
      Cec2_ManSimulateCis(p);
      pMan->vCexTriples->nSize = 0;
      bVar3 = false;
      for (lVar14 = 0; lVar14 < p->nObjs; lVar14 = lVar14 + 1) {
        iVar4 = (int)lVar14;
        pGVar8 = Gia_ManObj(p,iVar4);
        if (pGVar8 == (Gia_Obj_t *)0x0) break;
        uVar1 = *(ulong *)pGVar8;
        if (((((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar1) &&
             (pGVar8->Value == 0xffffffff)) && (((uint)p->pReprs[lVar14] >> 0x1d & 1) == 0)) &&
           ((pGVar8[-(uVar1 & 0x1fffffff)].Value != 0xffffffff &&
            (pGVar8[-(ulong)((uint)(uVar1 >> 0x20) & 0x1fffffff)].Value != 0xffffffff)))) {
          if (((uint)p->pReprs[lVar14] >> 0x1c & 1) != 0) {
            __assert_fail("!Gia_ObjProved(p, i) && !Gia_ObjFailed(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                          ,0x3c7,
                          "int Cec2_ManPerformSweeping(Gia_Man_t *, Cec2_Par_t *, Gia_Man_t **)");
          }
          pGVar10 = pMan->pNew;
          iVar5 = Gia_ObjFanin0Copy(pGVar8);
          iVar6 = Gia_ObjFanin1Copy(pGVar8);
          uVar7 = Gia_ManHashAnd(pGVar10,iVar5,iVar6);
          pGVar8->Value = uVar7;
          iVar5 = (pMan->pNew->vCopies2).nSize;
          iVar6 = Abc_Lit2Var(uVar7);
          if (iVar5 == iVar6) {
            pGVar10 = pMan->pNew;
            iVar5 = Abc_Lit2Var(pGVar8->Value);
            pGVar9 = Gia_ManObj(pGVar10,iVar5);
            uVar7 = Gia_ObjIsMuxType(pGVar9);
            *(ulong *)pGVar9 = *(ulong *)pGVar9 & 0xffffffffbfffffff | (ulong)((uVar7 & 1) << 0x1e);
            Gia_ObjSetPhase(pMan->pNew,pGVar9);
            Vec_IntPush(&pMan->pNew->vCopies2,-1);
          }
          if ((pMan->pNew->vCopies2).nSize != pMan->pNew->nObjs) {
            __assert_fail("Vec_IntSize(&pMan->pNew->vCopies2) == Gia_ManObjNum(pMan->pNew)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                          ,0x3d1,
                          "int Cec2_ManPerformSweeping(Gia_Man_t *, Cec2_Par_t *, Gia_Man_t **)");
          }
          pGVar9 = Gia_ObjReprObj(p,iVar4);
          if ((pGVar9 != (Gia_Obj_t *)0x0) && (pGVar9->Value != 0xffffffff)) {
            iVar5 = Abc_Lit2Var(pGVar8->Value);
            iVar6 = Abc_Lit2Var(pGVar9->Value);
            if (iVar5 == iVar6) {
              if ((pGVar9->Value ^ pGVar8->Value) !=
                  -((int)((uint)((ulong)*(undefined8 *)pGVar9 >> 0x20) ^
                         (uint)((ulong)*(undefined8 *)pGVar8 >> 0x20)) >> 0x1f)) {
                __assert_fail("(pObj->Value ^ pRepr->Value) == (pObj->fPhase ^ pRepr->fPhase)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                              ,0x3d7,
                              "int Cec2_ManPerformSweeping(Gia_Man_t *, Cec2_Par_t *, Gia_Man_t **)"
                             );
              }
              p->pReprs[lVar14] = (Gia_Rpr_t)((uint)p->pReprs[lVar14] | 0x10000000);
            }
            else {
              iVar5 = Cec2_ManSweepNode(pMan,iVar4);
              if (iVar5 == 0) {
                pGVar8->Value = 0xffffffff;
                pVVar2 = pMan->vCexTriples;
                iVar5 = Gia_ObjId(p,pGVar9);
                iVar6 = Abc_Var2Lit(p->iPatsPi,
                                    ((uint)((ulong)*(undefined8 *)pGVar9 >> 0x20) ^
                                    (uint)((ulong)*(undefined8 *)pGVar8 >> 0x20)) >> 0x1f);
                Vec_IntPush(pVVar2,iVar5);
                Vec_IntPush(pVVar2,iVar4);
                Vec_IntPush(pVVar2,iVar6);
                bVar3 = true;
              }
              else if ((p->pReprs[lVar14].field_0x3 & 0x10) != 0) {
                uVar7 = Abc_LitNotCond(pGVar9->Value,
                                       ((uint)((ulong)*(undefined8 *)pGVar9 >> 0x20) ^
                                       (uint)((ulong)*(undefined8 *)pGVar8 >> 0x20)) >> 0x1f);
                pGVar8->Value = uVar7;
              }
            }
          }
        }
      }
      if (bVar3) {
        uVar7 = Cec2_ManSimulate(p,pMan->vCexTriples,pMan);
        if ((uVar7 != 0) && (pPars->fVerbose != 0)) {
          printf("Failed to resimulate %d times with pattern = %d  (total = %d).\n",(ulong)uVar7,
                 (ulong)(uint)pMan->nPatterns,(ulong)(uint)(pPars->nSimWords << 6));
        }
        if ((pPars->fIsMiter != 0) && (iVar4 = Cec2_ManSimulateCos(p), iVar4 == 0)) break;
      }
      Cec2_ManPrintStats(p,pPars,pMan);
    }
    if (ppNew != (Gia_Man_t **)0x0) {
      iVar13 = 0;
      while ((iVar13 < p->nObjs && (pGVar8 = Gia_ManObj(p,iVar13), pGVar8 != (Gia_Obj_t *)0x0))) {
        if (((~*(uint *)pGVar8 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar8) &&
           (pGVar8->Value == 0xffffffff)) {
          pGVar10 = pMan->pNew;
          iVar4 = Gia_ObjFanin0Copy(pGVar8);
          iVar5 = Gia_ObjFanin1Copy(pGVar8);
          uVar7 = Gia_ManHashAnd(pGVar10,iVar4,iVar5);
          pGVar8->Value = uVar7;
        }
        iVar13 = iVar13 + 1;
      }
      iVar13 = 0;
      while ((iVar13 < p->vCos->nSize && (pGVar8 = Gia_ManCo(p,iVar13), pGVar8 != (Gia_Obj_t *)0x0))
            ) {
        pGVar10 = pMan->pNew;
        iVar4 = Gia_ObjFanin0Copy(pGVar8);
        iVar5 = Abc_Lit2Var(iVar4);
        if (pGVar10->nObjs <= iVar5) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        iVar5 = Abc_Lit2Var(iVar4);
        pGVar9 = Gia_ManObj(pGVar10,iVar5);
        if ((~*(uint *)pGVar9 & 0x1fffffff) != 0 && (int)*(uint *)pGVar9 < 0) {
          __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        pGVar9 = Gia_ManAppendObj(pGVar10);
        pGVar9->field_0x3 = pGVar9->field_0x3 | 0x80;
        iVar5 = Gia_ObjId(pGVar10,pGVar9);
        iVar6 = Abc_Lit2Var(iVar4);
        *(ulong *)pGVar9 =
             *(ulong *)pGVar9 & 0xffffffffe0000000 | (ulong)(iVar5 - iVar6 & 0x1fffffff);
        iVar4 = Abc_LitIsCompl(iVar4);
        uVar1 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar1 & 0xffffffffdfffffff | (ulong)(uint)(iVar4 << 0x1d);
        *(ulong *)pGVar9 =
             uVar1 & 0xe0000000dfffffff | (ulong)(uint)(iVar4 << 0x1d) |
             (ulong)(pGVar10->vCos->nSize & 0x1fffffff) << 0x20;
        pVVar2 = pGVar10->vCos;
        iVar4 = Gia_ObjId(pGVar10,pGVar9);
        Vec_IntPush(pVVar2,iVar4);
        if (pGVar10->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(pGVar10,pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff),
                           pGVar9);
        }
        iVar4 = Gia_ObjId(pGVar10,pGVar9);
        pGVar8->Value = iVar4 * 2;
        iVar13 = iVar13 + 1;
      }
      pGVar10 = Gia_ManCleanup(pMan->pNew);
      *ppNew = pGVar10;
      pcVar11 = Abc_UtilStrsav(p->pName);
      (*ppNew)->pName = pcVar11;
      pcVar11 = Abc_UtilStrsav(p->pSpec);
      (*ppNew)->pSpec = pcVar11;
    }
  }
LAB_00520ca7:
  Cec2_ManDestroy(pMan);
  return (int)(p->pCexSeq == (Abc_Cex_t *)0x0);
}

Assistant:

int Cec2_ManPerformSweeping( Gia_Man_t * p, Cec2_Par_t * pPars, Gia_Man_t ** ppNew )
{
    Cec2_Man_t * pMan = Cec2_ManCreate( p, pPars ); 
    Gia_Obj_t * pObj, * pRepr, * pObjNew; 
    int i, Iter, fDisproved = 1;

    // check if any output trivially fails under all-0 pattern
    Gia_ManRandomW( 1 );
    Gia_ManSetPhase( p );
    if ( pPars->fIsMiter ) 
    {
        Gia_ManForEachCo( p, pObj, i )
            if ( pObj->fPhase )
            {
                p->pCexSeq = Cec2_ManDeriveCex( p, i, -1 );
                goto finalize;
            }
    }

    // simulate one round and create classes
    Cec2_ManSimAlloc( p, pPars->nSimWords );
    Cec2_ManSimulateCis( p );
    Cec2_ManSimulate( p, NULL, pMan );
    if ( pPars->fIsMiter && !Cec2_ManSimulateCos(p) ) // cex detected
        goto finalize;
    Cec2_ManCreateClasses( p, pMan );
    Cec2_ManPrintStats( p, pPars, pMan );

    // perform additinal simulation
    for ( i = 0; i < pPars->nSimRounds; i++ )
    {
        Cec2_ManSimulateCis( p );
        Cec2_ManSimulate( p, NULL, pMan );
        if ( pPars->fIsMiter && !Cec2_ManSimulateCos(p) ) // cex detected
            goto finalize;
        Cec2_ManPrintStats( p, pPars, pMan );
    }
    // perform sweeping
    //pMan = Cec2_ManCreate( p, pPars );
    for ( Iter = 0; fDisproved && Iter < pPars->nItersMax; Iter++ )
    {
        fDisproved = 0;
        pMan->nPatterns = 0;
        Cec2_ManSimulateCis( p );
        Vec_IntClear( pMan->vCexTriples );
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( ~pObj->Value || Gia_ObjFailed(p, i) ) // skip swept nodes and failed nodes
                continue;
            if ( !~Gia_ObjFanin0(pObj)->Value || !~Gia_ObjFanin1(pObj)->Value ) // skip fanouts of non-swept nodes
                continue;
            assert( !Gia_ObjProved(p, i) && !Gia_ObjFailed(p, i) );
            // duplicate the node
            pObj->Value = Gia_ManHashAnd( pMan->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            if ( Vec_IntSize(&pMan->pNew->vCopies2) == Abc_Lit2Var(pObj->Value) )
            {
                pObjNew = Gia_ManObj( pMan->pNew, Abc_Lit2Var(pObj->Value) );
                pObjNew->fMark0 = Gia_ObjIsMuxType( pObjNew );
                Gia_ObjSetPhase( pMan->pNew, pObjNew );
                Vec_IntPush( &pMan->pNew->vCopies2, -1 );
            }
            assert( Vec_IntSize(&pMan->pNew->vCopies2) == Gia_ManObjNum(pMan->pNew) );
            pRepr = Gia_ObjReprObj( p, i );
            if ( pRepr == NULL || !~pRepr->Value )
                continue;
            if ( Abc_Lit2Var(pObj->Value) == Abc_Lit2Var(pRepr->Value) )
            {
                assert( (pObj->Value ^ pRepr->Value) == (pObj->fPhase ^ pRepr->fPhase) );
                Gia_ObjSetProved( p, i );
                continue;
            }
            if ( Cec2_ManSweepNode(pMan, i) )
            {
                if ( Gia_ObjProved(p, i) )
                    pObj->Value = Abc_LitNotCond( pRepr->Value, pObj->fPhase ^ pRepr->fPhase );
                continue;
            }
            pObj->Value = ~0;
            Vec_IntPushThree( pMan->vCexTriples, Gia_ObjId(p, pRepr), i, Abc_Var2Lit(p->iPatsPi, pObj->fPhase ^ pRepr->fPhase) );
            fDisproved = 1;
        }
        if ( fDisproved )
        {
            int Fails = Cec2_ManSimulate( p, pMan->vCexTriples, pMan );
            if ( Fails && pPars->fVerbose )
                printf( "Failed to resimulate %d times with pattern = %d  (total = %d).\n", Fails, pMan->nPatterns, pPars->nSimWords * 64 );
            if ( pPars->fIsMiter && !Cec2_ManSimulateCos(p) ) // cex detected
                break;
        }
        Cec2_ManPrintStats( p, pPars, pMan );
    }
    // finish the AIG, if it is not finished
    if ( ppNew )
    {
        Gia_ManForEachAnd( p, pObj, i )
            if ( !~pObj->Value ) 
                pObj->Value = Gia_ManHashAnd( pMan->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( p, pObj, i )
            pObj->Value = Gia_ManAppendCo( pMan->pNew, Gia_ObjFanin0Copy(pObj) );
        *ppNew = Gia_ManCleanup( pMan->pNew );
        (*ppNew)->pName = Abc_UtilStrsav( p->pName );
        (*ppNew)->pSpec = Abc_UtilStrsav( p->pSpec );
    }
finalize:
    Cec2_ManDestroy( pMan );
    //Gia_ManEquivPrintClasses( p, 1, 0 );
    return p->pCexSeq ? 0 : 1;
}